

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O0

ssize_t __thiscall
FIX::SocketConnection::read(SocketConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  SocketMonitor *socketMonitor;
  SocketConnection *extraout_RAX;
  undefined4 in_register_00000034;
  bool bVar1;
  SocketRecvFailed *e;
  SocketConnector *s_local;
  SocketConnection *this_local;
  
  bVar1 = this->m_pSession != (Session *)0x0;
  if (bVar1) {
    readFromSocket(this);
    socketMonitor =
         SocketConnector::getMonitor((SocketConnector *)CONCAT44(in_register_00000034,__fd));
    readMessages(this,socketMonitor);
    this = extraout_RAX;
  }
  return CONCAT71((int7)((ulong)this >> 8),bVar1);
}

Assistant:

bool SocketConnection::read(SocketConnector &s) {
  if (!m_pSession) {
    return false;
  }

  try {
    readFromSocket();
    readMessages(s.getMonitor());
  } catch (SocketRecvFailed &e) {
    m_pSession->getLog()->onEvent(e.what());
    return false;
  }
  return true;
}